

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printNoHashImmediate(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  undefined4 uVar3;
  MCOperand *op;
  int64_t iVar4;
  uint in_ESI;
  MCInst *in_RDI;
  uint tmp;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar4 = MCOperand_getImm(op);
  uVar3 = (undefined4)iVar4;
  printUInt32((SStream *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    if ((in_RDI->csh->doing_mem & 1U) == 0) {
      puVar1 = in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(undefined4 *)
       (in_RDI->flat_insn->detail->groups +
       (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar3;
      pcVar2 = in_RDI->flat_insn->detail;
      (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
    }
    else {
      pcVar2 = in_RDI->flat_insn->detail;
      (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + 0xff;
      in_RDI->flat_insn->detail->groups
      [(ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5f] = (uint8_t)uVar3;
      in_RDI->ac_idx = in_RDI->ac_idx + 0xff;
    }
  }
  return;
}

Assistant:

static void printNoHashImmediate(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned tmp = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	printUInt32(O, tmp);
	if (MI->csh->detail) {
		if (MI->csh->doing_mem) {
			MI->flat_insn->detail->arm.op_count--;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].neon_lane = (int8_t)tmp;
			MI->ac_idx--;	// consecutive operands share the same access right
		} else {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = tmp;
			MI->flat_insn->detail->arm.op_count++;
		}
	}
}